

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall detail::reader::operator()(reader *this,ptime *val)

{
  ptime pVar1;
  undefined1 local_38 [8];
  string iso_str;
  ptime *val_local;
  reader *this_local;
  
  iso_str.field_2._8_8_ = val;
  std::__cxx11::string::string((string *)local_38);
  operator()(this,(string *)local_38);
  pVar1 = boost::posix_time::from_iso_string((string *)local_38);
  *(base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
    *)iso_str.field_2._8_8_ =
       pVar1.
       super_base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
       .time_.time_count_.value_;
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void operator()(boost::posix_time::ptime& val) const {
        std::string iso_str;
        (*this)(iso_str);
        val = boost::posix_time::from_iso_string(iso_str);
    }